

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupTeamCityOutputTest::teardown
          (TEST_GROUP_CppUTestGroupTeamCityOutputTest *this)

{
  if (this->tcout != (TeamCityTestOutput *)0x0) {
    (*(this->tcout->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[1])();
  }
  if (this->tst != (UtestShell *)0x0) {
    (*this->tst->_vptr_UtestShell[1])();
  }
  if (this->f != (TestFailure *)0x0) {
    (*this->f->_vptr_TestFailure[1])();
  }
  if (this->f2 != (TestFailure *)0x0) {
    (*this->f2->_vptr_TestFailure[1])();
  }
  if (this->f3 != (TestFailure *)0x0) {
    (*this->f3->_vptr_TestFailure[1])();
  }
  if (this->result != (TestResult *)0x0) {
    (*this->result->_vptr_TestResult[1])();
    return;
  }
  return;
}

Assistant:

void teardown() _override
    {
        delete tcout;
        delete tst;
        delete f;
        delete f2;
        delete f3;
        delete result;
    }